

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O3

int ssl_handle_possible_reconnect(mbedtls_ssl_context *ssl)

{
  mbedtls_ssl_config *pmVar1;
  _func_int_void_ptr_uchar_ptr_ptr_uchar_ptr_uchar_ptr_size_t *p_Var2;
  ulong uVar3;
  uchar *puVar4;
  void *pvVar5;
  uchar *puVar6;
  uchar *puVar7;
  char cVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  uchar uVar16;
  int iVar17;
  int iVar18;
  int level;
  ulong uVar19;
  char *text;
  size_t sVar20;
  uchar *local_38;
  
  pmVar1 = ssl->conf;
  p_Var2 = pmVar1->f_cookie_write;
  iVar17 = -0x7100;
  if (pmVar1->f_cookie_check != (_func_int_void_ptr_uchar_ptr_size_t_uchar_ptr_size_t *)0x0 &&
      p_Var2 != (_func_int_void_ptr_uchar_ptr_ptr_uchar_ptr_uchar_ptr_size_t *)0x0) {
    uVar3 = ssl->in_left;
    iVar17 = -0x7900;
    if ((((((0x3c < uVar3) && (puVar4 = ssl->in_buf, *puVar4 == '\x16')) && (puVar4[3] == '\0')) &&
         ((puVar4[4] == '\0' && (puVar4[0x13] == '\0')))) &&
        ((puVar4[0x14] == '\0' &&
         ((puVar4[0x15] == '\0' && (uVar19 = (ulong)puVar4[0x3b], uVar19 <= uVar3 - 0x3d)))))) &&
       ((ulong)puVar4[uVar19 + 0x3c] <= uVar3 - 0x3c)) {
      pvVar5 = pmVar1->p_cookie;
      puVar6 = ssl->cli_id;
      sVar20 = ssl->cli_id_len;
      puVar7 = ssl->out_buf;
      iVar17 = (*pmVar1->f_cookie_check)
                         (pvVar5,puVar4 + uVar19 + 0x3d,(ulong)puVar4[uVar19 + 0x3c],puVar6,sVar20);
      if (iVar17 == 0) {
        mbedtls_debug_print_ret
                  (ssl,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                   ,0xd57,"ssl_check_dtls_clihlo_cookie",0);
        iVar17 = ssl_session_reset_int(ssl,1);
        if (iVar17 == 0) {
          return -0x6780;
        }
        text = "reset";
        level = 1;
        iVar18 = 0xd68;
        goto LAB_0013ee96;
      }
      uVar9 = *(undefined4 *)puVar4;
      uVar10 = *(undefined4 *)(puVar4 + 4);
      uVar11 = *(undefined4 *)(puVar4 + 8);
      uVar12 = *(undefined4 *)(puVar4 + 0xc);
      uVar13 = *(undefined4 *)(puVar4 + 0xd);
      uVar14 = *(undefined4 *)(puVar4 + 0x11);
      uVar15 = *(undefined4 *)(puVar4 + 0x15);
      *(undefined4 *)(puVar7 + 9) = *(undefined4 *)(puVar4 + 9);
      *(undefined4 *)(puVar7 + 0xd) = uVar13;
      *(undefined4 *)(puVar7 + 0x11) = uVar14;
      *(undefined4 *)(puVar7 + 0x15) = uVar15;
      *(undefined4 *)puVar7 = uVar9;
      *(undefined4 *)(puVar7 + 4) = uVar10;
      *(undefined4 *)(puVar7 + 8) = uVar11;
      *(undefined4 *)(puVar7 + 0xc) = uVar12;
      puVar7[0xd] = '\x03';
      puVar7[0x19] = 0xfe;
      puVar7[0x1a] = 0xff;
      local_38 = puVar7 + 0x1c;
      iVar18 = (*p_Var2)(pvVar5,&local_38,puVar7 + 0x4000,puVar6,sVar20);
      iVar17 = -0x6c00;
      if (iVar18 == 0) {
        sVar20 = (long)local_38 - (long)puVar7;
        cVar8 = (char)sVar20;
        puVar7[0x1b] = cVar8 + 0xe4;
        iVar17 = (int)sVar20;
        uVar16 = (uchar)((uint)(iVar17 + 0xffffe7) >> 0x10);
        puVar7[0x16] = uVar16;
        puVar7[0xe] = uVar16;
        uVar16 = (uchar)((uint)(iVar17 + 0xffe7) >> 8);
        puVar7[0x17] = uVar16;
        puVar7[0xf] = uVar16;
        puVar7[0x18] = cVar8 + 0xe7;
        puVar7[0x10] = cVar8 + 0xe7;
        puVar7[0xb] = (uchar)((uint)(iVar17 + 0xfff3) >> 8);
        puVar7[0xc] = cVar8 + 0xf3;
        mbedtls_debug_print_ret
                  (ssl,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
                   ,0xd57,"ssl_check_dtls_clihlo_cookie",-0x6a80);
        (*ssl->f_send)(ssl->p_bio,ssl->out_buf,sVar20);
        return -0x6a80;
      }
    }
  }
  text = "ssl_check_dtls_clihlo_cookie";
  level = 2;
  iVar18 = 0xd57;
LAB_0013ee96:
  mbedtls_debug_print_ret
            (ssl,level,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
             ,iVar18,text,iVar17);
  return iVar17;
}

Assistant:

static int ssl_handle_possible_reconnect( mbedtls_ssl_context *ssl )
{
    int ret;
    size_t len;

    ret = ssl_check_dtls_clihlo_cookie(
            ssl->conf->f_cookie_write,
            ssl->conf->f_cookie_check,
            ssl->conf->p_cookie,
            ssl->cli_id, ssl->cli_id_len,
            ssl->in_buf, ssl->in_left,
            ssl->out_buf, MBEDTLS_SSL_MAX_CONTENT_LEN, &len );

    MBEDTLS_SSL_DEBUG_RET( 2, "ssl_check_dtls_clihlo_cookie", ret );

    if( ret == MBEDTLS_ERR_SSL_HELLO_VERIFY_REQUIRED )
    {
        /* Dont check write errors as we can't do anything here.
         * If the error is permanent we'll catch it later,
         * if it's not, then hopefully it'll work next time. */
        (void) ssl->f_send( ssl->p_bio, ssl->out_buf, len );

        return( MBEDTLS_ERR_SSL_HELLO_VERIFY_REQUIRED );
    }

    if( ret == 0 )
    {
        /* Got a valid cookie, partially reset context */
        if( ( ret = ssl_session_reset_int( ssl, 1 ) ) != 0 )
        {
            MBEDTLS_SSL_DEBUG_RET( 1, "reset", ret );
            return( ret );
        }

        return( MBEDTLS_ERR_SSL_CLIENT_RECONNECT );
    }

    return( ret );
}